

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_helper.c
# Opt level: O1

int arg_parse_int_helper(arg *arg,char *err_msg)

{
  long lVar1;
  char *endptr;
  char *local_20;
  
  lVar1 = strtol(arg->val,&local_20,10);
  if (err_msg != (char *)0x0) {
    *err_msg = '\0';
  }
  if ((*arg->val == '\0') || (*local_20 != '\0')) {
    if (err_msg != (char *)0x0) {
      lVar1 = 0;
      snprintf(err_msg,200,"Option %s: Invalid character \'%c\'\n",arg->name,
               (ulong)(uint)(int)*local_20);
      goto LAB_0011f5cb;
    }
  }
  else {
    if ((int)lVar1 == lVar1) goto LAB_0011f5cb;
    if (err_msg != (char *)0x0) {
      snprintf(err_msg,200,"Option %s: Value %ld out of range for signed int\n",arg->name,lVar1);
    }
  }
  lVar1 = 0;
LAB_0011f5cb:
  return (int)lVar1;
}

Assistant:

int arg_parse_int_helper(const struct arg *arg, char *err_msg) {
  char *endptr;
  const long rawval = strtol(arg->val, &endptr, 10);  // NOLINT

  if (err_msg) err_msg[0] = '\0';

  if (arg->val[0] != '\0' && endptr[0] == '\0') {
    if (rawval >= INT_MIN && rawval <= INT_MAX) return (int)rawval;
    SET_ERR_STRING("Option %s: Value %ld out of range for signed int\n",
                   arg->name, rawval);
    return 0;
  }
  SET_ERR_STRING("Option %s: Invalid character '%c'\n", arg->name, *endptr);
  return 0;
}